

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  iterator iVar6;
  ConfigurePreset *pCVar7;
  TestPreset *pTVar8;
  PackagePreset *pPVar9;
  BuildPreset *pBVar10;
  ostream *poVar11;
  WorkflowStep *step;
  int *piVar12;
  char *this_00;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  long *plVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  static_string_view type;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view type_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  static_string_view type_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  static_string_view type_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  int stepNumber;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmCMakePresetsGraph settingsFile;
  allocator_type local_371;
  int local_370;
  int local_36c;
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  cmExternalMakefileProjectGeneratorFactory **local_328;
  pointer local_320;
  cmExternalMakefileProjectGeneratorFactory *local_318;
  char *local_310;
  _Base_ptr local_308;
  pointer local_300;
  undefined1 local_2f8 [16];
  _Alloc_hider local_2e8;
  _Base_ptr local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  static_string_view local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [40];
  _Alloc_hider local_280;
  _Base_ptr *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined1 local_260 [24];
  WorkflowStep *local_248;
  cmCMakePresetsGraph local_240;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&local_240.errors);
  paVar17 = &local_240.errors.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.errors._M_dataplus._M_p != paVar17) {
    operator_delete(local_240.errors._M_dataplus._M_p,
                    CONCAT71(local_240.errors.field_2._M_allocated_capacity._1_7_,
                             local_240.errors.field_2._M_local_buf[0]) + 1);
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&local_240.errors);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.errors._M_dataplus._M_p != paVar17) {
    operator_delete(local_240.errors._M_dataplus._M_p,
                    CONCAT71(local_240.errors.field_2._M_allocated_capacity._1_7_,
                             local_240.errors.field_2._M_local_buf[0]) + 1);
  }
  local_240.parseState.doc._M_dataplus._M_p = (pointer)&local_240.parseState.doc.field_2;
  local_240.errors._M_string_length = 0;
  local_240.errors.field_2._M_local_buf[0] = '\0';
  local_240.parseState.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.parseState.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.parseState.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.parseState.errors.
  super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.parseState.errors.
  super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.parseState.errors.
  super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.parseState.doc._M_string_length = 0;
  local_240.parseState.doc.field_2._M_local_buf[0] = '\0';
  local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_240.WorkflowPresets._M_t._M_impl.super__Rb_tree_header;
  local_240.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240.SourceDir._M_dataplus._M_p = (pointer)&local_240.SourceDir.field_2;
  local_240.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.SourceDir._M_string_length = 0;
  local_240.SourceDir.field_2._M_local_buf[0] = '\0';
  local_240.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.errors._M_dataplus._M_p = (pointer)paVar17;
  local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  local_240.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  bVar3 = cmCMakePresetsGraph::ReadProjectPresets(&local_240,psVar5,false);
  if (!bVar3) {
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    cmJSONState::GetErrorMessage_abi_cxx11_((string *)local_368,&local_240.parseState,true);
    local_348._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1c;
    local_348._8_8_ = "Could not read presets from ";
    local_338._M_allocated_capacity = 0;
    local_328 = (cmExternalMakefileProjectGeneratorFactory **)(psVar5->_M_dataplus)._M_p;
    local_338._8_8_ = psVar5->_M_string_length;
    local_320 = (pointer)0x0;
    local_318 = (cmExternalMakefileProjectGeneratorFactory *)0x1;
    local_310 = ":";
    local_308 = (_Base_ptr)0x0;
    local_300 = (pointer)local_368._8_8_;
    local_2f8._0_8_ = local_368._0_8_;
    views._M_len = 4;
    views._M_array = (iterator)local_348;
    local_2f8._8_8_ = (_Base_ptr)local_368;
    cmCatViews((string *)&local_2b8,views);
    cmSystemTools::Error((string *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8) {
      operator_delete((void *)local_2b8._M_allocated_capacity,(ulong)(local_2a8._0_8_ + 1));
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    iVar4 = 1;
    goto LAB_001d81b9;
  }
  if (listPresets == Yes) {
    iVar4 = 0;
    cmCMakePresetsGraph::PrintWorkflowPresetList(&local_240,(PrintPrecedingNewline *)0x0);
    goto LAB_001d81b9;
  }
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
          ::find(&local_240.WorkflowPresets._M_t,presetName);
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_348._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1b;
    local_348._8_8_ = "No such workflow preset in ";
    local_338._M_allocated_capacity = 0;
    local_328 = (cmExternalMakefileProjectGeneratorFactory **)(psVar5->_M_dataplus)._M_p;
    local_338._8_8_ = psVar5->_M_string_length;
    local_320 = (pointer)0x0;
    local_318 = (cmExternalMakefileProjectGeneratorFactory *)0x3;
    local_310 = ": \"";
    local_308 = (_Base_ptr)0x0;
    local_2f8._0_8_ = (presetName->_M_dataplus)._M_p;
    local_300 = (pointer)presetName->_M_string_length;
    local_2f8._8_8_ = (_Base_ptr)0x0;
    local_2e0 = (_Base_ptr)(local_2a8 + 8);
    local_2b8._M_allocated_capacity = 0;
    local_2b8._8_8_ = &DAT_00000001;
    local_2a8[8] = '\"';
    local_2e8._M_p = &DAT_00000001;
    local_2d8._M_allocated_capacity = 0;
    views_01._M_len = 5;
    views_01._M_array = (iterator)local_348;
    local_2a8._0_8_ = local_2e0;
    cmCatViews((string *)local_368,views_01);
    cmSystemTools::Error((string *)local_368);
  }
  else {
    if ((char)iVar6._M_node[4]._M_color != _S_black) {
      if ((char)iVar6._M_node[0x11]._M_color == _S_red) {
        local_348._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x24;
        local_348._8_8_ = "Could not evaluate workflow preset \"";
        local_338._M_allocated_capacity = 0;
        local_328 = (cmExternalMakefileProjectGeneratorFactory **)(presetName->_M_dataplus)._M_p;
        local_338._8_8_ = presetName->_M_string_length;
        local_320 = (pointer)0x0;
        local_318 = (cmExternalMakefileProjectGeneratorFactory *)0x1a;
        local_310 = "\": Invalid macro expansion";
        local_308 = (_Base_ptr)0x0;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_348;
        cmCatViews((string *)&local_2b8,views_02);
        cmSystemTools::Error((string *)&local_2b8);
        uVar13 = local_2a8._0_8_;
        uVar14 = local_2b8._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8) {
LAB_001d8180:
          operator_delete((void *)uVar14,
                          (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)uVar13)->_M_dataplus)._M_p + 1));
        }
      }
      else {
        if (*(char *)&iVar6._M_node[0xe]._M_left != '\0') {
          local_368._0_8_ = (int *)0x0;
          local_368._8_8_ = (pointer)0x0;
          local_368._16_8_ = 0;
          local_270._12_4_ = fresh;
          std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::reserve
                    ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_368,
                     ((long)iVar6._M_node[0x10]._M_left - (long)iVar6._M_node[0x10]._M_parent >> 3)
                     * -0x3333333333333333);
          local_370 = 1;
          step = (WorkflowStep *)iVar6._M_node[0x10]._M_parent;
          local_248 = (WorkflowStep *)iVar6._M_node[0x10]._M_left;
          if (step != local_248) {
            local_280._M_p = (pointer)&local_308;
            local_278 = (_Base_ptr *)local_280._M_p;
            local_270._M_allocated_capacity = (size_type)local_280._M_p;
            do {
              this_00 = local_348;
              iVar4 = local_370;
              switch(step->PresetType) {
              case Configure:
                type.super_string_view._M_str = "configure";
                type.super_string_view._M_len = 9;
                local_36c = local_370;
                pCVar7 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                   (this,type,&local_240.ConfigurePresets,step);
                if (pCVar7 == (ConfigurePreset *)0x0) {
LAB_001d819f:
                  iVar4 = 1;
                  goto LAB_001d81af;
                }
                psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                local_348._0_8_ = &local_338;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)this_00,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_328 = &local_318;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"--preset","");
                local_308 = (_Base_ptr)local_2f8;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_308,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                __l._M_len = 3;
                __l._M_array = (iterator)this_00;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2b8,__l,(allocator_type *)local_260);
                lVar15 = -0x60;
                plVar16 = (long *)local_2f8;
                do {
                  if (plVar16 != (long *)plVar16[-2]) {
                    this_00 = (char *)(*plVar16 + 1);
                    operator_delete((long *)plVar16[-2],(ulong)this_00);
                  }
                  plVar16 = plVar16 + -4;
                  lVar15 = lVar15 + 0x20;
                } while (lVar15 != 0);
                if (local_270._12_4_ == Yes) {
                  this_00 = "--fresh";
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[8]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_2b8._M_local_buf,(char (*) [8])"--fresh");
                }
                local_260._0_8_ = (void *)0x9;
                local_260._8_8_ = "configure";
                BuildWorkflowStep((function<int_()> *)local_348,(cmake *)this_00,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_2b8);
                iVar4 = local_36c;
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_368,&local_370,(static_string_view *)local_260,&step->PresetName
                           ,(function<int_()> *)local_348);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_338._M_allocated_capacity !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_338._M_allocated_capacity)
                            ((function<int_()> *)local_348,(function<int_()> *)local_348,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2b8);
                break;
              case Build:
                type_02.super_string_view._M_str = "build";
                type_02.super_string_view._M_len = 5;
                local_36c = local_370;
                pBVar10 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                    (this,type_02,&local_240.BuildPresets,step);
                if (pBVar10 == (BuildPreset *)0x0) goto LAB_001d819f;
                local_2c8.super_string_view._M_len = 5;
                local_2c8.super_string_view._M_str = "build";
                psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                local_348._0_8_ = &local_338;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)this_00,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_328 = &local_318;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"--build","");
                local_308 = (_Base_ptr)local_2f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"--preset","");
                local_2e8._M_p = (pointer)&local_2d8;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e8,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                __l_02._M_len = 4;
                __l_02._M_array = (iterator)this_00;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_260,__l_02,&local_371);
                BuildWorkflowStep((function<int_()> *)&local_2b8,(cmake *)this_00,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_260);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_368,&local_370,&local_2c8,&step->PresetName,
                           (function<int_()> *)&local_2b8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2a8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_2a8._0_8_)(&local_2b8,&local_2b8,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
                lVar15 = -0x80;
                paVar17 = &local_2d8;
                do {
                  if (paVar17 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar17->_M_allocated_capacity)[-2]) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)(&paVar17->_M_allocated_capacity)[-2],
                                    paVar17->_M_allocated_capacity + 1);
                  }
                  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(&paVar17->_M_allocated_capacity + -4);
                  lVar15 = lVar15 + 0x20;
                  iVar4 = local_36c;
                } while (lVar15 != 0);
                break;
              case Test:
                type_00.super_string_view._M_str = "test";
                type_00.super_string_view._M_len = 4;
                local_36c = local_370;
                pTVar8 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                   (this,type_00,&local_240.TestPresets,step);
                if (pTVar8 == (TestPreset *)0x0) goto LAB_001d819f;
                local_2c8.super_string_view._M_len = 4;
                local_2c8.super_string_view._M_str = "test";
                psVar5 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                local_348._0_8_ = &local_338;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)this_00,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_328 = &local_318;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"--preset","");
                local_308 = (_Base_ptr)local_2f8;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_308,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                __l_00._M_len = 3;
                __l_00._M_array = (iterator)this_00;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_260,__l_00,&local_371);
                BuildWorkflowStep((function<int_()> *)&local_2b8,(cmake *)this_00,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_260);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_368,&local_370,&local_2c8,&step->PresetName,
                           (function<int_()> *)&local_2b8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2a8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_2a8._0_8_)(&local_2b8,&local_2b8,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
                lVar15 = -0x60;
                plVar16 = (long *)local_2f8;
                do {
                  if (plVar16 != (long *)plVar16[-2]) {
                    operator_delete((long *)plVar16[-2],*plVar16 + 1);
                  }
                  plVar16 = plVar16 + -4;
                  lVar15 = lVar15 + 0x20;
                  iVar4 = local_36c;
                } while (lVar15 != 0);
                break;
              case Package:
                type_01.super_string_view._M_str = "package";
                type_01.super_string_view._M_len = 7;
                local_36c = local_370;
                pPVar9 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                   (this,type_01,&local_240.PackagePresets,step);
                if (pPVar9 == (PackagePreset *)0x0) goto LAB_001d819f;
                local_2c8.super_string_view._M_len = 7;
                local_2c8.super_string_view._M_str = "package";
                psVar5 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                local_348._0_8_ = &local_338;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)this_00,pcVar2,pcVar2 + psVar5->_M_string_length);
                local_328 = &local_318;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"--preset","");
                local_308 = (_Base_ptr)local_2f8;
                pcVar2 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_308,pcVar2,pcVar2 + (step->PresetName)._M_string_length)
                ;
                __l_01._M_len = 3;
                __l_01._M_array = (iterator)this_00;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_260,__l_01,&local_371);
                BuildWorkflowStep((function<int_()> *)&local_2b8,(cmake *)this_00,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_260);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)local_368,&local_370,&local_2c8,&step->PresetName,
                           (function<int_()> *)&local_2b8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2a8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (*(code *)local_2a8._0_8_)(&local_2b8,&local_2b8,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
                lVar15 = -0x60;
                plVar16 = (long *)local_2f8;
                do {
                  if (plVar16 != (long *)plVar16[-2]) {
                    operator_delete((long *)plVar16[-2],*plVar16 + 1);
                  }
                  plVar16 = plVar16 + -4;
                  lVar15 = lVar15 + 0x20;
                  iVar4 = local_36c;
                } while (lVar15 != 0);
              }
              local_370 = iVar4 + 1;
              step = step + 1;
            } while (step != local_248);
          }
          uVar13 = local_368._8_8_;
          if (local_368._0_8_ == local_368._8_8_) {
            iVar4 = 0;
          }
          else {
            bVar3 = true;
            piVar12 = (int *)local_368._0_8_;
            do {
              if (!bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Executing workflow step ",0x18);
              poVar11 = (ostream *)std::ostream::operator<<(&std::cout,*piVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," of ",4);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,*(char **)(piVar12 + 4),*(long *)(piVar12 + 2));
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," preset \"",9);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,*(char **)(piVar12 + 6),*(long *)(piVar12 + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n\n",3);
              std::ostream::flush();
              if (*(long *)(piVar12 + 0x12) == 0) {
                std::__throw_bad_function_call();
              }
              iVar4 = (**(code **)(piVar12 + 0x14))((_Any_data *)(piVar12 + 0xe));
              if (iVar4 != 0) break;
              piVar12 = piVar12 + 0x16;
              bVar3 = false;
              iVar4 = 0;
            } while (piVar12 != (int *)uVar13);
          }
LAB_001d81af:
          std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector
                    ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_368);
          goto LAB_001d81b9;
        }
        psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        local_2b8._M_local_buf[0] = 0x22;
        cmStrCat<char_const(&)[40],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                  ((string *)local_348,(char (*) [40])"Cannot use disabled workflow preset in ",
                   psVar5,(char (*) [4])0x7ed90c,presetName,local_2b8._M_local_buf);
        cmSystemTools::Error((string *)local_348);
        uVar13 = local_338._M_allocated_capacity;
        uVar14 = local_348._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._0_8_ != &local_338) goto LAB_001d8180;
      }
      iVar4 = 1;
      cmCMakePresetsGraph::PrintWorkflowPresetList(&local_240,(PrintPrecedingNewline *)0x0);
      goto LAB_001d81b9;
    }
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_348._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x25;
    local_348._8_8_ = "Cannot use hidden workflow preset in ";
    local_338._M_allocated_capacity = 0;
    local_328 = (cmExternalMakefileProjectGeneratorFactory **)(psVar5->_M_dataplus)._M_p;
    local_338._8_8_ = psVar5->_M_string_length;
    local_320 = (pointer)0x0;
    local_318 = (cmExternalMakefileProjectGeneratorFactory *)0x3;
    local_310 = ": \"";
    local_308 = (_Base_ptr)0x0;
    local_2f8._0_8_ = (presetName->_M_dataplus)._M_p;
    local_300 = (pointer)presetName->_M_string_length;
    local_2f8._8_8_ = (_Base_ptr)0x0;
    local_2e0 = (_Base_ptr)(local_2a8 + 8);
    local_2b8._M_allocated_capacity = 0;
    local_2b8._8_8_ = &DAT_00000001;
    local_2a8[8] = '\"';
    local_2e8._M_p = &DAT_00000001;
    local_2d8._M_allocated_capacity = 0;
    views_00._M_len = 5;
    views_00._M_array = (iterator)local_348;
    local_2a8._0_8_ = local_2e0;
    cmCatViews((string *)local_368,views_00);
    cmSystemTools::Error((string *)local_368);
  }
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
  }
  iVar4 = 1;
  cmCMakePresetsGraph::PrintWorkflowPresetList(&local_240,(PrintPrecedingNewline *)0x0);
LAB_001d81b9:
  cmCMakePresetsGraph::~cmCMakePresetsGraph(&local_240);
  return iVar4;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != true) {
    cmSystemTools::Error(cmStrCat("Could not read presets from ",
                                  this->GetHomeDirectory(), ":",
                                  settingsFile.parseState.GetErrorMessage()));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}